

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJsonObjects.cxx
# Opt level: O3

Value * cmDumpCTestInfo(Value *__return_storage_ptr__,cmake *cm)

{
  cmLocalGenerator *lg;
  cmTest *pcVar1;
  pointer pcVar2;
  pointer pbVar3;
  bool bVar4;
  Value *pVVar5;
  string *psVar6;
  _Rb_tree_node_base *p_Var7;
  _Base_ptr p_Var8;
  cmake *cm_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *cmd;
  pointer pbVar9;
  pointer ppcVar10;
  string *local_388;
  _Rb_tree_node_base *local_380;
  ValueHolder local_378;
  undefined8 local_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  Value *local_350;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  cge_value;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  vector<cmTest_*,_std::allocator<cmTest_*>_> tests_1;
  string command;
  cmGeneratorExpression ge;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  cmListFileBacktrace local_2c8;
  string *local_2b0;
  _Rb_tree_node_base *local_2a8;
  cmake *local_2a0;
  _Base_ptr local_298;
  _Base_ptr local_290;
  pointer local_288;
  pointer local_280;
  Value local_278;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_250;
  Value local_238;
  Value local_210;
  Value tests;
  Value pObj;
  Value entry;
  Value properties;
  Value local_148;
  Value local_120;
  Value local_f8;
  Value local_d0;
  Value local_a8;
  Value local_80;
  Value local_58;
  
  local_350 = __return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  Json::Value::Value(&local_238,arrayValue);
  (anonymous_namespace)::getConfigurations_abi_cxx11_
            (&local_250,(_anonymous_namespace_ *)cm->GlobalGenerator,cm_00);
  local_388 = local_250.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_2b0 = local_250.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_250.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_250.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_2a0 = cm;
    do {
      Json::Value::Value(&local_148,objectValue);
      Json::Value::Value(&local_80,local_388);
      pVVar5 = Json::Value::operator[](&local_148,&kNAME_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar5,&local_80);
      Json::Value::~Value(&local_80);
      Json::Value::Value(&local_210,arrayValue);
      local_380 = (cm->GlobalGenerator->ProjectMap)._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_left;
      local_2a8 = &(cm->GlobalGenerator->ProjectMap)._M_t._M_impl.super__Rb_tree_header._M_header;
      if (local_380 != local_2a8) {
        do {
          Json::Value::Value(&pObj,objectValue);
          Json::Value::Value(&local_f8,(string *)(local_380 + 1));
          pVVar5 = Json::Value::operator[](&pObj,&kNAME_KEY_abi_cxx11_);
          Json::Value::operator=(pVVar5,&local_f8);
          Json::Value::~Value(&local_f8);
          Json::Value::Value(&tests,arrayValue);
          p_Var8 = *(_Base_ptr *)(local_380 + 2);
          local_298 = local_380[2]._M_parent;
          if (p_Var8 != local_298) {
            do {
              cmLocalGenerator::GenerateTestFiles(*(cmLocalGenerator **)p_Var8);
              lg = *(cmLocalGenerator **)p_Var8;
              tests_1.super__Vector_base<cmTest_*,_std::allocator<cmTest_*>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              tests_1.super__Vector_base<cmTest_*,_std::allocator<cmTest_*>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              tests_1.super__Vector_base<cmTest_*,_std::allocator<cmTest_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_290 = p_Var8;
              cmMakefile::GetTests(lg->Makefile,local_388,&tests_1);
              local_288 = tests_1.super__Vector_base<cmTest_*,_std::allocator<cmTest_*>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              ppcVar10 = tests_1.super__Vector_base<cmTest_*,_std::allocator<cmTest_*>_>._M_impl.
                         super__Vector_impl_data._M_start;
              if (tests_1.super__Vector_base<cmTest_*,_std::allocator<cmTest_*>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  tests_1.super__Vector_base<cmTest_*,_std::allocator<cmTest_*>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                do {
                  pcVar1 = *ppcVar10;
                  local_280 = ppcVar10;
                  Json::Value::Value(&local_278,objectValue);
                  local_378.string_ = (char *)&local_368;
                  pcVar2 = (pcVar1->Name)._M_dataplus._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_378,pcVar2,pcVar2 + (pcVar1->Name)._M_string_length);
                  Json::Value::Value(&local_a8,(string *)&local_378);
                  pVVar5 = Json::Value::operator[](&local_278,&kCTEST_NAME_abi_cxx11_);
                  Json::Value::operator=(pVVar5,&local_a8);
                  Json::Value::~Value(&local_a8);
                  if (local_378 != &local_368) {
                    operator_delete(local_378.string_,
                                    CONCAT71(local_368._M_allocated_capacity._1_7_,
                                             local_368._M_local_buf[0]) + 1);
                  }
                  command._M_dataplus._M_p = (pointer)&command.field_2;
                  command._M_string_length = 0;
                  command.field_2._M_local_buf[0] = '\0';
                  pbVar3 = (pcVar1->Command).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  for (pbVar9 = (pcVar1->Command).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start; pbVar9 != pbVar3;
                      pbVar9 = pbVar9 + 1) {
                    std::__cxx11::string::_M_append
                              ((char *)&command,(ulong)(pbVar9->_M_dataplus)._M_p);
                    std::__cxx11::string::append((char *)&command);
                  }
                  local_2c8.TopEntry.
                  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = (element_type *)0x0;
                  local_2c8.TopEntry.
                  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  cmGeneratorExpression::cmGeneratorExpression(&ge,&local_2c8);
                  if (local_2c8.TopEntry.
                      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              (local_2c8.TopEntry.
                               super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi);
                  }
                  cmGeneratorExpression::Parse((cmGeneratorExpression *)&cge,(string *)&ge);
                  local_370 = 0;
                  local_368._M_local_buf[0] = '\0';
                  local_378.string_ = (char *)&local_368;
                  psVar6 = cmCompiledGeneratorExpression::Evaluate
                                     ((cmCompiledGeneratorExpression *)
                                      cge._M_t.
                                      super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                                      .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>
                                      ._M_head_impl,lg,local_388,false,(cmGeneratorTarget *)0x0,
                                      (cmGeneratorTarget *)0x0,
                                      (cmGeneratorExpressionDAGChecker *)0x0,(string *)&local_378);
                  if (local_378 != &local_368) {
                    operator_delete(local_378.string_,
                                    CONCAT71(local_368._M_allocated_capacity._1_7_,
                                             local_368._M_local_buf[0]) + 1);
                  }
                  Json::Value::Value((Value *)&local_378,psVar6);
                  pVVar5 = Json::Value::operator[](&local_278,&kCTEST_COMMAND_abi_cxx11_);
                  Json::Value::operator=(pVVar5,(Value *)&local_378);
                  Json::Value::~Value((Value *)&local_378);
                  Json::Value::Value(&properties,arrayValue);
                  for (p_Var7 = (pcVar1->Properties).
                                super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
                                ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                      (_Rb_tree_header *)p_Var7 !=
                      &(pcVar1->Properties).
                       super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
                       ._M_t._M_impl.super__Rb_tree_header;
                      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
                    Json::Value::Value(&entry,objectValue);
                    Json::Value::Value(&local_d0,(string *)(p_Var7 + 1));
                    pVVar5 = Json::Value::operator[](&entry,&kKEY_KEY_abi_cxx11_);
                    Json::Value::operator=(pVVar5,&local_d0);
                    Json::Value::~Value(&local_d0);
                    cmProperty::GetValue((cmProperty *)(p_Var7 + 2));
                    cmGeneratorExpression::Parse((cmGeneratorExpression *)&cge_value,(char *)&ge);
                    local_2e8._8_8_ = 0;
                    local_2d8._M_local_buf[0] = '\0';
                    local_2e8._M_allocated_capacity = (size_type)&local_2d8;
                    psVar6 = cmCompiledGeneratorExpression::Evaluate
                                       ((cmCompiledGeneratorExpression *)
                                        cge_value._M_t.
                                        super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                                        .
                                        super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>
                                        ._M_head_impl,lg,local_388,false,(cmGeneratorTarget *)0x0,
                                        (cmGeneratorTarget *)0x0,
                                        (cmGeneratorExpressionDAGChecker *)0x0,(string *)&local_2e8)
                    ;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2e8._M_allocated_capacity != &local_2d8) {
                      operator_delete((void *)local_2e8._M_allocated_capacity,
                                      CONCAT71(local_2d8._M_allocated_capacity._1_7_,
                                               local_2d8._M_local_buf[0]) + 1);
                    }
                    Json::Value::Value(&local_58,psVar6);
                    pVVar5 = Json::Value::operator[](&entry,&kVALUE_KEY_abi_cxx11_);
                    Json::Value::operator=(pVVar5,&local_58);
                    Json::Value::~Value(&local_58);
                    Json::Value::append(&properties,&entry);
                    std::
                    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                    ::~unique_ptr(&cge_value);
                    Json::Value::~Value(&entry);
                  }
                  Json::Value::Value(&entry,&properties);
                  pVVar5 = Json::Value::operator[](&local_278,&kPROPERTIES_KEY_abi_cxx11_);
                  Json::Value::operator=(pVVar5,&entry);
                  Json::Value::~Value(&entry);
                  Json::Value::~Value(&properties);
                  std::
                  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                  ::~unique_ptr(&cge);
                  cmGeneratorExpression::~cmGeneratorExpression(&ge);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)command._M_dataplus._M_p != &command.field_2) {
                    operator_delete(command._M_dataplus._M_p,
                                    CONCAT71(command.field_2._M_allocated_capacity._1_7_,
                                             command.field_2._M_local_buf[0]) + 1);
                  }
                  bVar4 = Json::Value::isNull(&local_278);
                  if (!bVar4) {
                    Json::Value::append(&tests,&local_278);
                  }
                  Json::Value::~Value(&local_278);
                  ppcVar10 = local_280 + 1;
                } while (ppcVar10 != local_288);
              }
              if (tests_1.super__Vector_base<cmTest_*,_std::allocator<cmTest_*>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(tests_1.super__Vector_base<cmTest_*,_std::allocator<cmTest_*>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)tests_1.
                                      super__Vector_base<cmTest_*,_std::allocator<cmTest_*>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)tests_1.
                                      super__Vector_base<cmTest_*,_std::allocator<cmTest_*>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
              p_Var8 = (_Base_ptr)&local_290->_M_parent;
              cm = local_2a0;
            } while (p_Var8 != local_298);
          }
          Json::Value::Value(&local_120,&tests);
          pVVar5 = Json::Value::operator[](&pObj,&kCTEST_INFO_abi_cxx11_);
          Json::Value::operator=(pVVar5,&local_120);
          Json::Value::~Value(&local_120);
          Json::Value::append(&local_210,&pObj);
          Json::Value::~Value(&tests);
          Json::Value::~Value(&pObj);
          local_380 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_380);
        } while (local_380 != local_2a8);
      }
      pVVar5 = Json::Value::operator[](&local_148,&kPROJECTS_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar5,&local_210);
      Json::Value::~Value(&local_210);
      Json::Value::append(&local_238,&local_148);
      Json::Value::~Value(&local_148);
      local_388 = local_388 + 1;
    } while (local_388 != local_2b0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_250);
  pVVar5 = Json::Value::operator[](local_350,&kCONFIGURATIONS_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar5,&local_238);
  Json::Value::~Value(&local_238);
  return local_350;
}

Assistant:

Json::Value cmDumpCTestInfo(const cmake* cm)
{
  Json::Value result = Json::objectValue;
  result[kCONFIGURATIONS_KEY] = DumpCTestConfigurationsList(cm);
  return result;
}